

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onExitAssignStatementAstNode
          (CompilerAstWalker *this,AssignStatementAstNode *node)

{
  bool mustBeTrue;
  element_type *this_00;
  element_type *var;
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  size_t sStack_20;
  bool find;
  size_t index;
  AssignStatementAstNode *node_local;
  CompilerAstWalker *this_local;
  
  sStack_20 = 0;
  index = (size_t)node;
  node_local = (AssignStatementAstNode *)this;
  this_00 = std::
            __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->ec);
  var = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   (index + 8));
  mustBeTrue = EmissionContext::GetDeclarationIndex
                         (this_00,&var->value,&stack0xffffffffffffffe0,false);
  local_21 = mustBeTrue;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Could not find local declaration for assign statement",&local_49);
  Error::assertWithPanic(mustBeTrue,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  emit(this,SetLocal,sStack_20);
  return;
}

Assistant:

void onExitAssignStatementAstNode(AssignStatementAstNode* node) noexcept override {
    std::size_t index = 0;
    bool find = this->ec->GetDeclarationIndex(node->identifier->value, index, false);
    Error::assertWithPanic(find, "Could not find local declaration for assign statement");
    this->emit(bytecode::ByteCodeInstruction::SetLocal, index);
  }